

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adksys_glibc.c
# Opt level: O2

void * adksys_get_public_adiak_symbol(void)

{
  void *pvVar1;
  long lVar2;
  
  dlerror();
  pvVar1 = (void *)dlsym(0,"adiak_public");
  lVar2 = dlerror();
  if (lVar2 != 0) {
    pvVar1 = (void *)0x0;
  }
  return pvVar1;
}

Assistant:

void *adksys_get_public_adiak_symbol()
{
   void *result;
   
   dlerror();
   result = dlsym(RTLD_DEFAULT, "adiak_public");
   if (dlerror())
      return NULL;
   return result;
}